

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status leveldb::anon_unknown_1::PosixError(string *context,int error_number)

{
  Status extraout_RAX;
  int in_ECX;
  Code code;
  undefined4 in_register_00000034;
  Slice local_38;
  Slice local_28;
  
  local_28.data_ = (char *)CONCAT44(in_register_00000034,error_number);
  if (in_ECX == 2) {
    local_38.data_ = strerror(2);
    local_38.size_ = strlen(local_38.data_);
    code = kNotFound;
  }
  else {
    local_38.data_ = strerror(in_ECX);
    local_38.size_ = strlen(local_38.data_);
    code = kIOError;
  }
  Status::Status((Status *)context,code,&local_28,&local_38);
  return (Status)extraout_RAX.state_;
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}